

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_end
          (JUnitReporter *this,CurrentTestCaseStats *param_1)

{
  pointer pSVar1;
  pointer pSVar2;
  long lVar3;
  pointer this_00;
  undefined1 auVar4 [16];
  double dVar5;
  timeval t;
  _Vector_impl_data in_stack_ffffffffffffffb8;
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  lVar3 = (local_30.tv_sec * 1000000 + local_30.tv_usec) - (this->timer).m_ticks;
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  dVar5 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0;
  dVar5 = (double)(~-(ulong)(dVar5 < 0.0001) & (ulong)dVar5);
  (this->testCaseData).testcases.
  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].time = dVar5;
  (this->testCaseData).totalSeconds = (this->testCaseData).totalSeconds + dVar5;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)&stack0xffffffffffffffb8,
             &this->deepestSubcaseStackNames);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase
            (&this->testCaseData,
             (vector<doctest::String,_std::allocator<doctest::String>_>)in_stack_ffffffffffffffb8);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
            ((vector<doctest::String,_std::allocator<doctest::String>_> *)&stack0xffffffffffffffb8);
  pSVar1 = (this->deepestSubcaseStackNames).
           super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->deepestSubcaseStackNames).
           super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      String::~String(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar2);
    (this->deepestSubcaseStackNames).
    super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats&) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();
        }